

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O2

int Ssw_ObjSatNum(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  uint uVar3;
  int nCapMin;
  ulong uVar5;
  long lVar4;
  
  p_00 = p->vSatVars;
  uVar1 = pObj->Id;
  uVar3 = p_00->nSize;
  if ((int)uVar1 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  else {
    uVar5 = (long)(int)uVar1 + 1;
    iVar2 = p_00->nCap * 2;
    nCapMin = (int)uVar5;
    if ((iVar2 <= (int)uVar1) || (nCapMin = iVar2, p_00->nCap <= (int)uVar1)) {
      Vec_IntGrow(p_00,nCapMin);
      uVar3 = p_00->nSize;
    }
    for (lVar4 = (long)(int)uVar3; lVar4 < (long)uVar5; lVar4 = lVar4 + 1) {
      p_00->pArray[lVar4] = 0;
    }
    p_00->nSize = (int)uVar5;
  }
  if ((-1 < (int)uVar1) && ((int)uVar1 < (int)uVar5)) {
    return p_00->pArray[uVar1];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int  Ssw_ObjSatNum( Ssw_Sat_t * p, Aig_Obj_t * pObj )             { return Vec_IntGetEntry( p->vSatVars, pObj->Id );  }